

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableMergeDrawChannels(ImGuiTable *table)

{
  ImVec2 *pIVar1;
  undefined8 *puVar2;
  int *piVar3;
  ImVector<unsigned_short> *pIVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  char cVar8;
  byte bVar9;
  byte bVar10;
  ImDrawCmd *pIVar11;
  ImDrawChannel *pIVar12;
  int iVar13;
  int iVar14;
  undefined8 uVar15;
  unsigned_short *puVar16;
  undefined8 uVar17;
  ImGuiContext *pIVar18;
  int iVar19;
  ImDrawChannel *pIVar20;
  int n;
  long lVar21;
  int iVar22;
  int iVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  MergeGroup *merge_group;
  ImGuiTableColumn *pIVar27;
  byte bVar28;
  float *pfVar29;
  uint uVar30;
  ImDrawChannel *pIVar31;
  ulong uVar32;
  uint uVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  ImBitArray<132> remaining_mask;
  ImBitArray<132> local_f8;
  float local_d8 [2];
  undefined8 uStack_d0;
  int iStack_c8;
  uint local_c4 [37];
  
  pIVar18 = GImGui;
  cVar8 = table->FreezeRowsCount;
  bVar9 = table->FreezeColumnsCount;
  uVar30 = 0;
  memset(local_d8,0,0xa0);
  iVar19 = table->ColumnsCount;
  if (0 < (long)iVar19) {
    uVar25 = table->VisibleMaskByIndex;
    uVar26 = 0;
    do {
      if ((uVar25 >> (uVar26 & 0x3f) & 1) != 0) {
        pIVar27 = (table->Columns).Data + uVar26;
        pIVar20 = (table->DrawSplitter)._Channels.Data;
        uVar33 = 1;
        do {
          bVar28 = (byte)uVar33;
          bVar10 = *(byte *)((long)&pIVar27->Flags + ((ulong)uVar33 ^ 0x59));
          iVar22 = pIVar20[bVar10]._CmdBuffer.Size;
          if (0 < (long)iVar22) {
            pIVar31 = pIVar20 + bVar10;
            pIVar11 = (pIVar31->_CmdBuffer).Data;
            if (pIVar11[(long)iVar22 + -1].ElemCount == 0) {
              iVar22 = iVar22 + -1;
              (pIVar31->_CmdBuffer).Size = iVar22;
            }
            if (iVar22 == 1) {
              if ((pIVar27->Flags & 0x80) == 0) {
                if (cVar8 < '\x01') {
                  fVar34 = pIVar27->ContentMaxXUnfrozen;
LAB_0015ff5b:
                  uVar33 = -(uint)(pIVar27->ContentMaxXHeadersUsed <= fVar34);
                  fVar34 = (float)(~uVar33 & (uint)pIVar27->ContentMaxXHeadersUsed |
                                  (uint)fVar34 & uVar33);
                }
                else {
                  if (bVar28 != 0) {
                    fVar34 = pIVar27->ContentMaxXFrozen;
                    goto LAB_0015ff5b;
                  }
                  fVar34 = pIVar27->ContentMaxXUnfrozen;
                }
                pIVar1 = &(pIVar27->ClipRect).Max;
                if (pIVar1->x <= fVar34 && fVar34 != pIVar1->x) goto LAB_00160032;
              }
              uVar33 = ((byte)~bVar28 & 1) * 2;
              if (cVar8 < '\x01') {
                uVar33 = 2;
              }
              uVar33 = uVar33 | (bVar9 <= uVar26 || (char)bVar9 < '\x01');
              uVar32 = (ulong)uVar33;
              pfVar29 = local_d8 + uVar32 * 10;
              iVar22 = local_c4[uVar32 * 10 + -1];
              if (iVar22 == 0) {
                pfVar29[0] = 3.4028235e+38;
                pfVar29[1] = 3.4028235e+38;
                (&uStack_d0)[uVar32 * 5] = 0xff7fffffff7fffff;
                fVar34 = 3.4028235e+38;
              }
              else {
                fVar34 = *pfVar29;
              }
              local_c4[uVar32 * 10 + (ulong)(bVar10 >> 5)] =
                   local_c4[uVar32 * 10 + (ulong)(bVar10 >> 5)] | 1 << (bVar10 & 0x1f);
              local_c4[uVar32 * 10 + -1] = iVar22 + 1;
              fVar5 = (pIVar11->ClipRect).x;
              if (fVar5 < fVar34) {
                *pfVar29 = fVar5;
              }
              fVar34 = (pIVar11->ClipRect).y;
              if (fVar34 < local_d8[uVar32 * 10 + 1]) {
                local_d8[uVar32 * 10 + 1] = fVar34;
              }
              fVar34 = (pIVar11->ClipRect).z;
              if (*(float *)(&uStack_d0 + uVar32 * 5) <= fVar34 &&
                  fVar34 != *(float *)(&uStack_d0 + uVar32 * 5)) {
                *(float *)(&uStack_d0 + uVar32 * 5) = fVar34;
              }
              fVar34 = (pIVar11->ClipRect).w;
              pfVar29 = (float *)((long)&uStack_d0 + uVar32 * 0x28 + 4);
              if (*pfVar29 <= fVar34 && fVar34 != *pfVar29) {
                *(float *)((long)&uStack_d0 + uVar32 * 0x28 + 4) = fVar34;
              }
              uVar30 = uVar30 | 1 << uVar33;
            }
          }
LAB_00160032:
          uVar33 = 0;
        } while (('\0' < cVar8 & bVar28) != 0);
        pIVar27->DrawChannelCurrent = 0xff;
      }
      uVar26 = uVar26 + 1;
    } while (uVar26 != (long)iVar19);
    if (uVar30 != 0) {
      iVar23 = (table->DrawSplitter)._Count;
      iVar19 = iVar23 + -2;
      iVar22 = (pIVar18->DrawChannelsTempMergeBuffer).Capacity;
      if (iVar22 < iVar19) {
        if (iVar22 == 0) {
          iVar22 = 8;
        }
        else {
          iVar22 = iVar22 / 2 + iVar22;
        }
        if (iVar22 <= iVar19) {
          iVar22 = iVar19;
        }
        pIVar20 = (ImDrawChannel *)MemAlloc((long)iVar22 << 5);
        pIVar31 = (pIVar18->DrawChannelsTempMergeBuffer).Data;
        if (pIVar31 != (ImDrawChannel *)0x0) {
          memcpy(pIVar20,pIVar31,(long)(pIVar18->DrawChannelsTempMergeBuffer).Size << 5);
          MemFree((pIVar18->DrawChannelsTempMergeBuffer).Data);
        }
        (pIVar18->DrawChannelsTempMergeBuffer).Data = pIVar20;
        (pIVar18->DrawChannelsTempMergeBuffer).Capacity = iVar22;
        iVar23 = (table->DrawSplitter)._Count;
      }
      else {
        pIVar20 = (pIVar18->DrawChannelsTempMergeBuffer).Data;
      }
      (pIVar18->DrawChannelsTempMergeBuffer).Size = iVar19;
      local_f8.Storage[0] = 0;
      local_f8.Storage[1] = 0;
      local_f8.Storage[2] = 0;
      local_f8.Storage[3] = 0;
      local_f8.Storage[4] = 0;
      ImBitArray<132>::SetBitRange(&local_f8,2,iVar23);
      bVar10 = table->Bg2DrawChannelUnfrozen & 0x1f;
      local_f8.Storage[table->Bg2DrawChannelUnfrozen >> 5] =
           local_f8.Storage[table->Bg2DrawChannelUnfrozen >> 5] &
           (-2 << bVar10 | 0xfffffffeU >> 0x20 - bVar10);
      iVar19 = ((table->DrawSplitter)._Count - (uint)('\0' < cVar8)) + -2;
      fVar34 = (table->HostClipRect).Min.x;
      fVar5 = (table->HostClipRect).Min.y;
      fVar6 = (table->HostClipRect).Max.x;
      fVar7 = (table->HostClipRect).Max.y;
      lVar24 = (long)local_c4;
      uVar25 = 0;
      do {
        iVar22 = local_c4[uVar25 * 10 + -1];
        if (iVar22 != 0) {
          fVar35 = local_d8[uVar25 * 10];
          fVar36 = local_d8[uVar25 * 10 + 1];
          fVar38 = *(float *)(&uStack_d0 + uVar25 * 5);
          fVar37 = *(float *)((long)&uStack_d0 + uVar25 * 0x28 + 4);
          if (((uVar25 & 1) == 0 || (char)bVar9 < '\x01') && (fVar34 <= fVar35)) {
            fVar35 = fVar34;
          }
          if ((uVar25 < 2 || cVar8 < '\x01') && (fVar5 <= fVar36)) {
            fVar36 = fVar5;
          }
          if ((uVar25 & 1) != 0) {
            uVar30 = -(uint)(fVar6 <= fVar38);
            fVar38 = (float)(~uVar30 & (uint)fVar6 | (uint)fVar38 & uVar30);
          }
          if ((1 < uVar25) && ((table->Flags & 0x20000) == 0)) {
            uVar30 = -(uint)(fVar7 <= fVar37);
            fVar37 = (float)(~uVar30 & (uint)fVar7 | (uint)fVar37 & uVar30);
          }
          lVar21 = 0;
          do {
            local_f8.Storage[lVar21] = local_f8.Storage[lVar21] & ~*(uint *)(lVar24 + lVar21 * 4);
            lVar21 = lVar21 + 1;
          } while (lVar21 != 5);
          iVar19 = iVar19 - iVar22;
          iVar23 = (table->DrawSplitter)._Count;
          if (0 < iVar23) {
            lVar21 = 8;
            uVar26 = 0;
            do {
              uVar32 = uVar26 >> 5 & 0x7ffffff;
              if ((local_c4[uVar25 * 10 + uVar32] >> ((uint)uVar26 & 0x1f) & 1) != 0) {
                local_c4[uVar25 * 10 + uVar32] =
                     local_c4[uVar25 * 10 + uVar32] & ~(1 << ((byte)uVar26 & 0x1f));
                iVar22 = iVar22 + -1;
                pIVar31 = (table->DrawSplitter)._Channels.Data;
                pfVar29 = *(float **)((long)&(pIVar31->_CmdBuffer).Size + lVar21);
                *pfVar29 = fVar35;
                pfVar29[1] = fVar36;
                pfVar29[2] = fVar38;
                pfVar29[3] = fVar37;
                puVar2 = (undefined8 *)((long)pIVar31 + lVar21 + -8);
                uVar15 = *puVar2;
                pIVar11 = (ImDrawCmd *)puVar2[1];
                piVar3 = (int *)((long)&(pIVar31->_CmdBuffer).Data + lVar21);
                iVar23 = piVar3[1];
                iVar13 = piVar3[2];
                iVar14 = piVar3[3];
                (pIVar20->_IdxBuffer).Size = *piVar3;
                (pIVar20->_IdxBuffer).Capacity = iVar23;
                *(int *)&(pIVar20->_IdxBuffer).Data = iVar13;
                *(int *)((long)&(pIVar20->_IdxBuffer).Data + 4) = iVar14;
                (pIVar20->_CmdBuffer).Size = (int)uVar15;
                (pIVar20->_CmdBuffer).Capacity = (int)((ulong)uVar15 >> 0x20);
                (pIVar20->_CmdBuffer).Data = pIVar11;
                pIVar20 = pIVar20 + 1;
                iVar23 = (table->DrawSplitter)._Count;
              }
              uVar26 = uVar26 + 1;
            } while (((long)uVar26 < (long)iVar23) && (lVar21 = lVar21 + 0x20, iVar22 != 0));
          }
        }
        if (uVar25 == 1 && '\0' < cVar8) {
          pIVar12 = (table->DrawSplitter)._Channels.Data;
          pIVar31 = pIVar12 + table->Bg2DrawChannelUnfrozen;
          iVar23 = (pIVar31->_CmdBuffer).Size;
          iVar13 = (pIVar31->_CmdBuffer).Capacity;
          pIVar11 = (pIVar31->_CmdBuffer).Data;
          pIVar4 = &pIVar12[table->Bg2DrawChannelUnfrozen]._IdxBuffer;
          iVar22 = pIVar4->Capacity;
          puVar16 = pIVar4->Data;
          (pIVar20->_IdxBuffer).Size = pIVar4->Size;
          (pIVar20->_IdxBuffer).Capacity = iVar22;
          (pIVar20->_IdxBuffer).Data = puVar16;
          (pIVar20->_CmdBuffer).Size = iVar23;
          (pIVar20->_CmdBuffer).Capacity = iVar13;
          (pIVar20->_CmdBuffer).Data = pIVar11;
          pIVar20 = pIVar20 + 1;
        }
        uVar25 = uVar25 + 1;
        lVar24 = lVar24 + 0x28;
      } while (uVar25 != 4);
      iVar22 = (table->DrawSplitter)._Count;
      if ((0 < iVar22) && (iVar19 != 0)) {
        lVar24 = 0;
        uVar25 = 0;
        do {
          if ((local_f8.Storage[uVar25 >> 5 & 0x7ffffff] >> ((uint)uVar25 & 0x1f) & 1) != 0) {
            pIVar31 = (table->DrawSplitter)._Channels.Data;
            puVar2 = (undefined8 *)((long)&(pIVar31->_CmdBuffer).Size + lVar24);
            uVar15 = *puVar2;
            pIVar11 = (ImDrawCmd *)puVar2[1];
            puVar2 = (undefined8 *)((long)&(pIVar31->_IdxBuffer).Size + lVar24);
            uVar17 = *puVar2;
            puVar16 = (unsigned_short *)puVar2[1];
            (pIVar20->_IdxBuffer).Size = (int)uVar17;
            (pIVar20->_IdxBuffer).Capacity = (int)((ulong)uVar17 >> 0x20);
            (pIVar20->_IdxBuffer).Data = puVar16;
            (pIVar20->_CmdBuffer).Size = (int)uVar15;
            (pIVar20->_CmdBuffer).Capacity = (int)((ulong)uVar15 >> 0x20);
            (pIVar20->_CmdBuffer).Data = pIVar11;
            pIVar20 = pIVar20 + 1;
            iVar19 = iVar19 + -1;
            iVar22 = (table->DrawSplitter)._Count;
          }
          uVar25 = uVar25 + 1;
        } while (((long)uVar25 < (long)iVar22) && (lVar24 = lVar24 + 0x20, iVar19 != 0));
      }
      memcpy((table->DrawSplitter)._Channels.Data + 2,(pIVar18->DrawChannelsTempMergeBuffer).Data,
             (long)iVar22 * 0x20 - 0x40);
    }
  }
  return;
}

Assistant:

void ImGui::TableMergeDrawChannels(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    ImDrawListSplitter* splitter = &table->DrawSplitter;
    const bool has_freeze_v = (table->FreezeRowsCount > 0);
    const bool has_freeze_h = (table->FreezeColumnsCount > 0);
    IM_ASSERT(splitter->_Current == 0);

    // Track which groups we are going to attempt to merge, and which channels goes into each group.
    struct MergeGroup
    {
        ImRect  ClipRect;
        int     ChannelsCount;
        ImBitArray<IMGUI_TABLE_MAX_DRAW_CHANNELS> ChannelsMask;
    };
    int merge_group_mask = 0x00;
    MergeGroup merge_groups[4];
    memset(merge_groups, 0, sizeof(merge_groups));

    // 1. Scan channels and take note of those which can be merged
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if ((table->VisibleMaskByIndex & ((ImU64)1 << column_n)) == 0)
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        const int merge_group_sub_count = has_freeze_v ? 2 : 1;
        for (int merge_group_sub_n = 0; merge_group_sub_n < merge_group_sub_count; merge_group_sub_n++)
        {
            const int channel_no = (merge_group_sub_n == 0) ? column->DrawChannelFrozen : column->DrawChannelUnfrozen;

            // Don't attempt to merge if there are multiple draw calls within the column
            ImDrawChannel* src_channel = &splitter->_Channels[channel_no];
            if (src_channel->_CmdBuffer.Size > 0 && src_channel->_CmdBuffer.back().ElemCount == 0)
                src_channel->_CmdBuffer.pop_back();
            if (src_channel->_CmdBuffer.Size != 1)
                continue;

            // Find out the width of this merge group and check if it will fit in our column
            // (note that we assume that rendering didn't stray on the left direction. we should need a CursorMinPos to detect it)
            if (!(column->Flags & ImGuiTableColumnFlags_NoClip))
            {
                float content_max_x;
                if (!has_freeze_v)
                    content_max_x = ImMax(column->ContentMaxXUnfrozen, column->ContentMaxXHeadersUsed); // No row freeze
                else if (merge_group_sub_n == 0)
                    content_max_x = ImMax(column->ContentMaxXFrozen, column->ContentMaxXHeadersUsed);   // Row freeze: use width before freeze
                else
                    content_max_x = column->ContentMaxXUnfrozen;                                        // Row freeze: use width after freeze
                if (content_max_x > column->ClipRect.Max.x)
                    continue;
            }

            const int merge_group_n = (has_freeze_h && column_n < table->FreezeColumnsCount ? 0 : 1) + (has_freeze_v && merge_group_sub_n == 0 ? 0 : 2);
            IM_ASSERT(channel_no < IMGUI_TABLE_MAX_DRAW_CHANNELS);
            MergeGroup* merge_group = &merge_groups[merge_group_n];
            if (merge_group->ChannelsCount == 0)
                merge_group->ClipRect = ImRect(+FLT_MAX, +FLT_MAX, -FLT_MAX, -FLT_MAX);
            merge_group->ChannelsMask.SetBit(channel_no);
            merge_group->ChannelsCount++;
            merge_group->ClipRect.Add(src_channel->_CmdBuffer[0].ClipRect);
            merge_group_mask |= (1 << merge_group_n);
        }

        // Invalidate current draw channel
        // (we don't clear DrawChannelFrozen/DrawChannelUnfrozen solely to facilitate debugging/later inspection of data)
        column->DrawChannelCurrent = (ImGuiTableDrawChannelIdx)-1;
    }

    // [DEBUG] Display merge groups
#if 0
    if (g.IO.KeyShift)
        for (int merge_group_n = 0; merge_group_n < IM_ARRAYSIZE(merge_groups); merge_group_n++)
        {
            MergeGroup* merge_group = &merge_groups[merge_group_n];
            if (merge_group->ChannelsCount == 0)
                continue;
            char buf[32];
            ImFormatString(buf, 32, "MG%d:%d", merge_group_n, merge_group->ChannelsCount);
            ImVec2 text_pos = merge_group->ClipRect.Min + ImVec2(4, 4);
            ImVec2 text_size = CalcTextSize(buf, NULL);
            GetForegroundDrawList()->AddRectFilled(text_pos, text_pos + text_size, IM_COL32(0, 0, 0, 255));
            GetForegroundDrawList()->AddText(text_pos, IM_COL32(255, 255, 0, 255), buf, NULL);
            GetForegroundDrawList()->AddRect(merge_group->ClipRect.Min, merge_group->ClipRect.Max, IM_COL32(255, 255, 0, 255));
        }
#endif

    // 2. Rewrite channel list in our preferred order
    if (merge_group_mask != 0)
    {
        // We skip channel 0 (Bg0/Bg1) and 1 (Bg2 frozen) from the shuffling since they won't move - see channels allocation in TableSetupDrawChannels().
        const int LEADING_DRAW_CHANNELS = 2;
        g.DrawChannelsTempMergeBuffer.resize(splitter->_Count - LEADING_DRAW_CHANNELS); // Use shared temporary storage so the allocation gets amortized
        ImDrawChannel* dst_tmp = g.DrawChannelsTempMergeBuffer.Data;
        ImBitArray<IMGUI_TABLE_MAX_DRAW_CHANNELS> remaining_mask;                       // We need 132-bit of storage
        remaining_mask.ClearAllBits();
        remaining_mask.SetBitRange(LEADING_DRAW_CHANNELS, splitter->_Count);
        remaining_mask.ClearBit(table->Bg2DrawChannelUnfrozen);
        IM_ASSERT(has_freeze_v == false || table->Bg2DrawChannelUnfrozen != TABLE_DRAW_CHANNEL_BG2_FROZEN);
        int remaining_count = splitter->_Count - (has_freeze_v ? LEADING_DRAW_CHANNELS + 1 : LEADING_DRAW_CHANNELS);
        //ImRect host_rect = (table->InnerWindow == table->OuterWindow) ? table->InnerClipRect : table->HostClipRect;
        ImRect host_rect = table->HostClipRect;
        for (int merge_group_n = 0; merge_group_n < IM_ARRAYSIZE(merge_groups); merge_group_n++)
        {
            if (int merge_channels_count = merge_groups[merge_group_n].ChannelsCount)
            {
                MergeGroup* merge_group = &merge_groups[merge_group_n];
                ImRect merge_clip_rect = merge_group->ClipRect;

                // Extend outer-most clip limits to match those of host, so draw calls can be merged even if
                // outer-most columns have some outer padding offsetting them from their parent ClipRect.
                // The principal cases this is dealing with are:
                // - On a same-window table (not scrolling = single group), all fitting columns ClipRect -> will extend and match host ClipRect -> will merge
                // - Columns can use padding and have left-most ClipRect.Min.x and right-most ClipRect.Max.x != from host ClipRect -> will extend and match host ClipRect -> will merge
                // FIXME-TABLE FIXME-WORKRECT: We are wasting a merge opportunity on tables without scrolling if column doesn't fit
                // within host clip rect, solely because of the half-padding difference between window->WorkRect and window->InnerClipRect.
                if ((merge_group_n & 1) == 0 || !has_freeze_h)
                    merge_clip_rect.Min.x = ImMin(merge_clip_rect.Min.x, host_rect.Min.x);
                if ((merge_group_n & 2) == 0 || !has_freeze_v)
                    merge_clip_rect.Min.y = ImMin(merge_clip_rect.Min.y, host_rect.Min.y);
                if ((merge_group_n & 1) != 0)
                    merge_clip_rect.Max.x = ImMax(merge_clip_rect.Max.x, host_rect.Max.x);
                if ((merge_group_n & 2) != 0 && (table->Flags & ImGuiTableFlags_NoHostExtendY) == 0)
                    merge_clip_rect.Max.y = ImMax(merge_clip_rect.Max.y, host_rect.Max.y);
#if 0
                GetOverlayDrawList()->AddRect(merge_group->ClipRect.Min, merge_group->ClipRect.Max, IM_COL32(255, 0, 0, 200), 0.0f, ~0, 1.0f);
                GetOverlayDrawList()->AddLine(merge_group->ClipRect.Min, merge_clip_rect.Min, IM_COL32(255, 100, 0, 200));
                GetOverlayDrawList()->AddLine(merge_group->ClipRect.Max, merge_clip_rect.Max, IM_COL32(255, 100, 0, 200));
#endif
                remaining_count -= merge_group->ChannelsCount;
                for (int n = 0; n < IM_ARRAYSIZE(remaining_mask.Storage); n++)
                    remaining_mask.Storage[n] &= ~merge_group->ChannelsMask.Storage[n];
                for (int n = 0; n < splitter->_Count && merge_channels_count != 0; n++)
                {
                    // Copy + overwrite new clip rect
                    if (!merge_group->ChannelsMask.TestBit(n))
                        continue;
                    merge_group->ChannelsMask.ClearBit(n);
                    merge_channels_count--;

                    ImDrawChannel* channel = &splitter->_Channels[n];
                    IM_ASSERT(channel->_CmdBuffer.Size == 1 && merge_clip_rect.Contains(ImRect(channel->_CmdBuffer[0].ClipRect)));
                    channel->_CmdBuffer[0].ClipRect = merge_clip_rect.ToVec4();
                    memcpy(dst_tmp++, channel, sizeof(ImDrawChannel));
                }
            }

            // Make sure Bg2DrawChannelUnfrozen appears in the middle of our groups (whereas Bg0/Bg1 and Bg2 frozen are fixed to 0 and 1)
            if (merge_group_n == 1 && has_freeze_v)
                memcpy(dst_tmp++, &splitter->_Channels[table->Bg2DrawChannelUnfrozen], sizeof(ImDrawChannel));
        }

        // Append unmergeable channels that we didn't reorder at the end of the list
        for (int n = 0; n < splitter->_Count && remaining_count != 0; n++)
        {
            if (!remaining_mask.TestBit(n))
                continue;
            ImDrawChannel* channel = &splitter->_Channels[n];
            memcpy(dst_tmp++, channel, sizeof(ImDrawChannel));
            remaining_count--;
        }
        IM_ASSERT(dst_tmp == g.DrawChannelsTempMergeBuffer.Data + g.DrawChannelsTempMergeBuffer.Size);
        memcpy(splitter->_Channels.Data + LEADING_DRAW_CHANNELS, g.DrawChannelsTempMergeBuffer.Data, (splitter->_Count - LEADING_DRAW_CHANNELS) * sizeof(ImDrawChannel));
    }
}